

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall FIX::HttpConnection::processStream(HttpConnection *this)

{
  bool bVar1;
  string msg;
  HttpMessage request;
  string local_88;
  HttpMessage local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  bVar1 = readMessage(this,&local_88);
  if (bVar1) {
    HttpMessage::HttpMessage(&local_68,&local_88);
    processRequest(this,&local_68);
    HttpMessage::~HttpMessage(&local_68);
  }
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void HttpConnection::processStream() {
  std::string msg;
  try {
    if (!readMessage(msg)) {
      return;
    }
    HttpMessage request(msg);
    processRequest(request);
  } catch (InvalidMessage &) {
    disconnect(400);
    return;
  }

  return;
}